

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osMutex.cpp
# Opt level: O2

void osMutex::dump_info(ostream *out)

{
  long lVar1;
  ostream *poVar2;
  long lVar3;
  int iVar4;
  string file;
  string owner;
  string state;
  string name;
  
  std::operator<<(out,
                  "--------------------+-------+--------------------+------+--------------------\n")
  ;
  std::operator<<(out," Name               | State | Owner              | Line | File\n");
  std::operator<<(out,
                  "--------------------+-------+--------------------+------+--------------------\n")
  ;
  LockListMutex();
  for (lVar3 = 0; lVar3 != 0x80; lVar3 = lVar3 + 8) {
    lVar1 = *(long *)((long)MutexList + lVar3);
    if (lVar1 != 0) {
      std::__cxx11::string::string((string *)&name,*(char **)(lVar1 + 0x28),(allocator *)&state);
      state._M_dataplus._M_p = (pointer)&state.field_2;
      state._M_string_length = 0;
      state.field_2._M_local_buf[0] = '\0';
      owner._M_dataplus._M_p = (pointer)&owner.field_2;
      owner._M_string_length = 0;
      owner.field_2._M_local_buf[0] = '\0';
      file._M_dataplus._M_p = (pointer)&file.field_2;
      file._M_string_length = 0;
      file.field_2._M_local_buf[0] = '\0';
      iVar4 = -1;
      if (*(long *)(lVar1 + 0x30) != 0) {
        iVar4 = *(int *)(lVar1 + 0x38);
        std::__cxx11::string::assign((char *)&file);
      }
      *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 0x10) = 0x14;
      poVar2 = std::operator<<(out,(string *)&name);
      *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 0;
      std::operator<<(poVar2,"|");
      *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 0x10) = 7;
      poVar2 = std::operator<<(out,(string *)&state);
      *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 0;
      std::operator<<(poVar2,"|");
      *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 0x10) = 0x14;
      poVar2 = std::operator<<(out,(string *)&owner);
      *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 0;
      std::operator<<(poVar2,"|");
      *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 0x10) = 6;
      poVar2 = (ostream *)std::ostream::operator<<(out,iVar4);
      *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 0;
      std::operator<<(poVar2,"|");
      *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 0x10) = 0;
      poVar2 = std::operator<<(out,(string *)&file);
      *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 0;
      std::operator<<(poVar2,"\n");
      std::__cxx11::string::~string((string *)&file);
      std::__cxx11::string::~string((string *)&owner);
      std::__cxx11::string::~string((string *)&state);
      std::__cxx11::string::~string((string *)&name);
    }
  }
  UnlockListMutex();
  return;
}

Assistant:

void osMutex::dump_info(std::ostream& out)
{
    out << "--------------------+-------+--------------------+------+--------------------\n";
    out << " Name               | State | Owner              | Line | File\n";
    out << "--------------------+-------+--------------------+------+--------------------\n";

    LockListMutex();
    for (int i = 0; i < MAX_MUTEX; i++)
    {
        osMutex* mutex = MutexList[i];
        if (mutex != nullptr)
        {
            std::string name = mutex->Name;
            std::string state;
            std::string owner;
            int line = -1;
            std::string file;
            if (mutex->OwnerFile)
            {
                line = mutex->OwnerLine;
                file = mutex->OwnerFile;
            }
            out << std::setw(20) << name << std::setw(0) << "|";
            out << std::setw(7) << state << std::setw(0) << "|";
            out << std::setw(20) << owner << std::setw(0) << "|";
            out << std::setw(6) << line << std::setw(0) << "|";
            out << std::setw(0) << file << std::setw(0) << "\n";
        }
    }
    UnlockListMutex();
}